

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_file_create(BigFile *bf,char *basename)

{
  int iVar1;
  char *pcVar2;
  char *basename_local;
  BigFile *bf_local;
  
  pcVar2 = _strdup(basename);
  bf->basename = pcVar2;
  iVar1 = _big_file_mksubdir_r((char *)0x0,basename);
  if (iVar1 == 0) {
    bf_local._4_4_ = 0;
  }
  else {
    _big_file_raise((char *)0x0,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0xc9);
    bf_local._4_4_ = -1;
  }
  return bf_local._4_4_;
}

Assistant:

int big_file_create(BigFile * bf, const char * basename) {
    bf->basename = _strdup(basename);
    RAISEIF(0 != _big_file_mksubdir_r(NULL, basename),
        ex_subdir,
        NULL);
    return 0;
ex_subdir:
    return -1;
}